

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O3

void av1_set_ssim_rdmult(AV1_COMP *cpi,int *errorperbit,BLOCK_SIZE bsize,int mi_row,int mi_col,
                        int *rdmult)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  undefined7 in_register_00000011;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  
  iVar4 = (cpi->common).mi_params.mi_rows;
  iVar6 = iVar4 + 3;
  iVar4 = iVar4 + 6;
  if (-1 < iVar6) {
    iVar4 = iVar6;
  }
  uVar3 = CONCAT71(in_register_00000011,bsize) & 0xffffffff;
  iVar6 = mi_row + 3;
  if (-1 < mi_row) {
    iVar6 = mi_row;
  }
  iVar6 = iVar6 >> 2;
  iVar8 = ("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar3] + 3
          >> 2) + iVar6;
  if (iVar4 >> 2 < iVar8) {
    iVar8 = iVar4 >> 2;
  }
  dVar13 = 0.0;
  dVar12 = 1.0;
  if (iVar6 < iVar8) {
    iVar9 = (cpi->common).mi_params.mi_cols;
    iVar4 = iVar9 + 3;
    iVar9 = iVar9 + 6;
    if (-1 < iVar4) {
      iVar9 = iVar4;
    }
    iVar9 = iVar9 >> 2;
    iVar4 = mi_col + 3;
    if (-1 < mi_col) {
      iVar4 = mi_col;
    }
    iVar4 = iVar4 >> 2;
    iVar1 = ("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar3] + 3
            >> 2) + iVar4;
    if (iVar9 < iVar1) {
      iVar1 = iVar9;
    }
    lVar7 = (long)iVar6;
    lVar10 = lVar7 * iVar9 * 8;
    dVar12 = 1.0;
    do {
      if (iVar4 < iVar1) {
        lVar11 = (long)iVar4;
        do {
          dVar12 = dVar12 * *(double *)
                             ((long)cpi->ssim_rdmult_scaling_factors + lVar11 * 8 + lVar10);
          dVar13 = dVar13 + 1.0;
          lVar11 = lVar11 + 1;
        } while (iVar1 != lVar11);
      }
      lVar7 = lVar7 + 1;
      lVar10 = lVar10 + (long)iVar9 * 8;
    } while (lVar7 != iVar8);
  }
  dVar12 = pow(dVar12,1.0 / dVar13);
  uVar2 = (uint)((double)*rdmult * dVar12 + 0.5);
  uVar5 = 0;
  if (0 < (int)uVar2) {
    uVar5 = uVar2;
  }
  *rdmult = uVar5;
  *errorperbit = (uVar5 >> 6) + (uint)(uVar5 >> 6 == 0);
  return;
}

Assistant:

void av1_set_ssim_rdmult(const AV1_COMP *const cpi, int *errorperbit,
                         const BLOCK_SIZE bsize, const int mi_row,
                         const int mi_col, int *const rdmult) {
  const AV1_COMMON *const cm = &cpi->common;

  const BLOCK_SIZE bsize_base = BLOCK_16X16;
  const int num_mi_w = mi_size_wide[bsize_base];
  const int num_mi_h = mi_size_high[bsize_base];
  const int num_cols = (cm->mi_params.mi_cols + num_mi_w - 1) / num_mi_w;
  const int num_rows = (cm->mi_params.mi_rows + num_mi_h - 1) / num_mi_h;
  const int num_bcols = (mi_size_wide[bsize] + num_mi_w - 1) / num_mi_w;
  const int num_brows = (mi_size_high[bsize] + num_mi_h - 1) / num_mi_h;
  int row, col;
  double num_of_mi = 0.0;
  double geom_mean_of_scale = 1.0;

  // To avoid overflow of 'geom_mean_of_scale', bsize_base must be at least
  // BLOCK_8X8.
  //
  // For bsize=BLOCK_128X128 and bsize_base=BLOCK_8X8, the loop below would
  // iterate 256 times. Considering the maximum value of
  // cpi->ssim_rdmult_scaling_factors (see av1_set_mb_ssim_rdmult_scaling()),
  // geom_mean_of_scale can go up to 4.8323^256, which is within DBL_MAX
  // (maximum value a double data type can hold). If bsize_base is modified to
  // BLOCK_4X4 (minimum possible block size), geom_mean_of_scale can go up
  // to 4.8323^1024 and exceed DBL_MAX, resulting in data overflow.
  assert(bsize_base >= BLOCK_8X8);
  assert(cpi->oxcf.tune_cfg.tuning == AOM_TUNE_SSIM ||
         cpi->oxcf.tune_cfg.tuning == AOM_TUNE_IQ ||
         cpi->oxcf.tune_cfg.tuning == AOM_TUNE_SSIMULACRA2);

  for (row = mi_row / num_mi_w;
       row < num_rows && row < mi_row / num_mi_w + num_brows; ++row) {
    for (col = mi_col / num_mi_h;
         col < num_cols && col < mi_col / num_mi_h + num_bcols; ++col) {
      const int index = row * num_cols + col;
      assert(cpi->ssim_rdmult_scaling_factors[index] != 0.0);
      geom_mean_of_scale *= cpi->ssim_rdmult_scaling_factors[index];
      num_of_mi += 1.0;
    }
  }
  geom_mean_of_scale = pow(geom_mean_of_scale, (1.0 / num_of_mi));

  *rdmult = (int)((double)(*rdmult) * geom_mean_of_scale + 0.5);
  *rdmult = AOMMAX(*rdmult, 0);
  av1_set_error_per_bit(errorperbit, *rdmult);
}